

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O0

int32 compute_mllr(float32 *****regl,float32 ****regr,uint32 *veclen,uint32 nclass,uint32 nfeat,
                  uint32 mllrmult,uint32 mllradd,float32 *****A,float32 ****B)

{
  uint n;
  int32 iVar1;
  float32 ****ppppfVar2;
  float32 ***pppfVar3;
  float32 **ppfVar4;
  float32 *pfVar5;
  float32 *ABloc;
  float32 ***Bloc;
  float32 ****Aloc;
  uint32 len;
  uint32 m;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 mllrmult_local;
  uint32 nfeat_local;
  uint32 nclass_local;
  uint32 *veclen_local;
  float32 ****regr_local;
  float32 *****regl_local;
  
  ppppfVar2 = (float32 ****)
              __ckd_calloc_2d__((ulong)nclass,(ulong)nfeat,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                ,0x6f);
  pppfVar3 = (float32 ***)
             __ckd_calloc_2d__((ulong)nclass,(ulong)nfeat,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                               ,0x70);
  Aloc._4_4_ = 0;
  do {
    if (nclass <= Aloc._4_4_) {
      *A = ppppfVar2;
      *B = pppfVar3;
      return 0;
    }
    for (k = 0; k < nfeat; k = k + 1) {
      n = veclen[k];
      ppfVar4 = (float32 **)
                __ckd_calloc_2d__((ulong)n,(ulong)n,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                  ,0x84);
      ppppfVar2[Aloc._4_4_][k] = ppfVar4;
      pfVar5 = (float32 *)
               __ckd_calloc__((ulong)n,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                              ,0x85);
      pppfVar3[Aloc._4_4_][k] = pfVar5;
      pfVar5 = (float32 *)
               __ckd_calloc__((ulong)(n + 1),8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                              ,0x86);
      if ((mllrmult == 0) || (mllradd != 0)) {
        if ((mllrmult == 0) && (mllradd != 0)) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                  ,0xa1,"Computing only additive part of MLLR\n");
          for (m = 0; m < n; m = m + 1) {
            for (len = 0; len < n; len = len + 1) {
              ppppfVar2[Aloc._4_4_][k][m][len] = 0.0;
            }
            ppppfVar2[Aloc._4_4_][k][m][m] = 1.0;
          }
          for (m = 0; m < n; m = m + 1) {
            if ((float)regl[Aloc._4_4_][k][m][n][n] <= 1.2e-38) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                      ,0xaf,
                      "%th dimension of addition term of %dth MLLR adaptation underflow!\nSet to zero...\n"
                      ,(ulong)m);
              pppfVar3[Aloc._4_4_][k][m] = 0.0;
            }
            else {
              pppfVar3[Aloc._4_4_][k][m] =
                   (float32)(((float)regr[Aloc._4_4_][k][m][n] - (float)regl[Aloc._4_4_][k][m][n][m]
                             ) / (float)regl[Aloc._4_4_][k][m][n][n]);
            }
          }
        }
        else if ((mllrmult == 0) || (mllradd == 0)) {
          if ((mllrmult == 0) && (mllradd == 0)) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0xcb,"ERROR: MLLR flags are not set\n");
            exit(1);
          }
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                  ,0xb6,"Computing both multiplicative and additive part of MLLR\n");
          for (m = 0; m < n; m = m + 1) {
            iVar1 = solve(regl[Aloc._4_4_][k][m],regr[Aloc._4_4_][k][m],pfVar5,n + 1);
            if (iVar1 == 0) {
              for (len = 0; len < n; len = len + 1) {
                ppppfVar2[Aloc._4_4_][k][m][len] = pfVar5[len];
              }
              pppfVar3[Aloc._4_4_][k][m] = pfVar5[n];
            }
            else {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                      ,0xba,"Estimation of %d th regression in MLLR failed\n",(ulong)m);
              for (len = 0; len < n; len = len + 1) {
                ppppfVar2[Aloc._4_4_][k][m][len] = 0.0;
              }
              ppppfVar2[Aloc._4_4_][k][m][m] = 1.0;
              pppfVar3[Aloc._4_4_][k][m] = 0.0;
            }
          }
        }
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                ,0x8a,"Computing only multiplicative part of MLLR\n");
        for (m = 0; m < n; m = m + 1) {
          pppfVar3[Aloc._4_4_][k][m] = 0.0;
        }
        for (m = 0; m < n; m = m + 1) {
          iVar1 = solve(regl[Aloc._4_4_][k][m],regr[Aloc._4_4_][k][m],pfVar5,n);
          if (iVar1 == 0) {
            for (len = 0; len < n; len = len + 1) {
              ppppfVar2[Aloc._4_4_][k][m][len] = pfVar5[len];
            }
          }
          else {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0x92,"Estimation of %d th multiplicative"," term in MLLR regression failed\n",
                    (ulong)m);
            for (len = 0; len < n; len = len + 1) {
              ppppfVar2[Aloc._4_4_][k][m][len] = 0.0;
            }
            ppppfVar2[Aloc._4_4_][k][m][m] = 1.0;
          }
        }
      }
      ckd_free(pfVar5);
    }
    Aloc._4_4_ = Aloc._4_4_ + 1;
  } while( true );
}

Assistant:

int32
compute_mllr (
             float32 *****regl,
             float32 ****regr,
             const uint32  *veclen,
             uint32  nclass,
             uint32  nfeat,
             uint32  mllrmult,
             uint32  mllradd,
             float32 *****A,
             float32 ****B
            )
{
    uint32  i,j,k,m,len;
    float32 ****Aloc, ***Bloc;
    float32 *ABloc=NULL;

    Aloc = (float32 ****) ckd_calloc_2d(nclass, nfeat, sizeof(float32 ***));
    Bloc = (float32 ***) ckd_calloc_2d(nclass, nfeat, sizeof(float32 **));

#if 0
    dump_regmat_statistics(regl,
			   regr,
			   nclass,
			   nfeat
			   veclen);

#endif
    /* Here, regl is the same as Legetter's G, while regr is Z.  The
     * original papers use the formula w_i^T = G(i)^{-1} z_i^T to
     * calculate the rows of W (the transformation matrix).  However
     * what they really mean by this is that we solve for w_i^T in the
     * equation G(i) w_i^T = z_i^T.  That is what this code does,
     * optionally omitting the bias or rotation parts of W. */
    for (m = 0; m < nclass; m++) {
	for (i = 0; i < nfeat; i++) {
	    len = veclen[i];

	    Aloc[m][i] = (float32 **) ckd_calloc_2d(len, len, sizeof(float32));
	    Bloc[m][i] = (float32 *) ckd_calloc(len, sizeof(float32));
	    ABloc = (float32 *) ckd_calloc(len+1, sizeof(float64));
 
	    if (mllrmult && !mllradd) {
		/* Compute only multiplicative part of MLLR*/
		E_INFO("Computing only multiplicative part of MLLR\n"); 
		for (j = 0; j < len; j++) {
		    Bloc[m][i][j] = 0.0;
		}
		for (j = 0; j < len; ++j) {
		    /** If estimation of rotation not possible, dont rotate **/
		    if (solve(regl[m][i][j],regr[m][i][j],ABloc,len) != S3_SUCCESS){
			E_INFO("Estimation of %d th multiplicative",
			       " term in MLLR regression failed\n",j);
			for (k = 0;k < len; k++) {
			    Aloc[m][i][j][k] = 0.0;
			}
			Aloc[m][i][j][j] = 1.0;
		    }
		    else {
			for (k = 0; k < len; k++) {
			    Aloc[m][i][j][k] = ABloc[k];
			}
		    }
		}
	    }
	    else if(!mllrmult && mllradd){
		/* Compute only additive part of MLLR*/
		E_INFO("Computing only additive part of MLLR\n"); 
		for (j = 0; j < len; j++) {
		    for (k = 0; k < len; k++) {
			Aloc[m][i][j][k] = 0.0;
		    }
		    Aloc[m][i][j][j] = 1.0;
		}
		for (j = 0; j < len; j++) {
		    /** If estimation of shift not possible, dont shift **/
		    if (regl[m][i][j][len][len] > MIN_IEEE_NORM_POS_FLOAT32) {
			Bloc[m][i][j] = (regr[m][i][j][len]-regl[m][i][j][len][j])/
			    regl[m][i][j][len][len];
		    }
		    else {
			E_INFO("%th dimension of addition term of %dth MLLR adaptation underflow!\nSet to zero...\n",j);
			Bloc[m][i][j] = 0.0;
		    }
		}
	    }
	    else if (mllrmult && mllradd) {
		/* Compute both multiplicative and additive part of MLLR*/
		E_INFO("Computing both multiplicative and additive part of MLLR\n");
		for (j = 0; j < len; ++j) {
		    /** If estimation of regression not possible, dont do anything **/
		    if (solve(regl[m][i][j],regr[m][i][j],ABloc,len+1) != S3_SUCCESS) {
			E_INFO("Estimation of %d th regression in MLLR failed\n",j);
			for (k = 0;k < len; k++) {
			    Aloc[m][i][j][k] = 0.0;
			}
			Aloc[m][i][j][j] = 1.0;
			Bloc[m][i][j] = 0.0;
		    }
		    else {
			for (k = 0; k < len; ++k) {
			    Aloc[m][i][j][k] = ABloc[k];
			}
			Bloc[m][i][j] = ABloc[len];
		    }
		}
	    }
	    else if(!mllrmult && !mllradd){
		/*MLLR flags are not set - Error*/
		E_FATAL("ERROR: MLLR flags are not set\n"); 
	    }
	    ckd_free(ABloc);
	}
    }
    *A = Aloc;
    *B = Bloc;

    return S3_SUCCESS;
}